

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

void duckdb::SetArgumentType(ScalarFunction *bound_function,LogicalType *type,bool is_operator)

{
  vector<duckdb::LogicalType,_true> *this;
  pointer pLVar1;
  reference pvVar2;
  undefined3 in_register_00000011;
  LogicalType *arg;
  pointer this_00;
  
  if (CONCAT31(in_register_00000011,is_operator) == 0) {
    pLVar1 = *(pointer *)
              ((long)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                      _M_impl.super__Vector_impl_data + 8);
    for (this_00 = (bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pLVar1;
        this_00 = this_00 + 1) {
      LogicalType::operator=(this_00,type);
    }
    pvVar2 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.varargs;
  }
  else {
    this = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
    pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(this,0);
    LogicalType::operator=(pvVar2,type);
    pvVar2 = vector<duckdb::LogicalType,_true>::get<true>(this,1);
  }
  LogicalType::operator=(pvVar2,type);
  LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,type);
  return;
}

Assistant:

static void SetArgumentType(ScalarFunction &bound_function, const LogicalType &type, bool is_operator) {
	if (is_operator) {
		bound_function.arguments[0] = type;
		bound_function.arguments[1] = type;
		bound_function.return_type = type;
		return;
	}

	for (auto &arg : bound_function.arguments) {
		arg = type;
	}
	bound_function.varargs = type;
	bound_function.return_type = type;
}